

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccopy.c
# Opt level: O2

void ccopy_(integer *n,singlecomplex *cx,integer *incx,singlecomplex *cy,integer *incy)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  singlecomplex *psVar5;
  ulong uVar6;
  singlecomplex *psVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  uVar1 = *n;
  uVar4 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    iVar2 = *incx;
    if ((long)iVar2 == 1) {
      iVar8 = *incy;
      if (iVar8 == 1) {
        for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
          cy[uVar6] = cx[uVar6];
        }
        return;
      }
      iVar9 = 1 - uVar1;
      lVar10 = 1;
    }
    else {
      iVar9 = 1 - uVar1;
      iVar3 = iVar2 * iVar9 + 1;
      if (-1 < iVar2) {
        iVar3 = 1;
      }
      iVar8 = *incy;
      lVar10 = (long)iVar3;
    }
    iVar3 = 1;
    if (iVar8 < 0) {
      iVar3 = iVar9 * iVar8 + 1;
    }
    psVar5 = cy + (long)iVar3 + -1;
    psVar7 = cx + lVar10 + -1;
    while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
      *psVar5 = *psVar7;
      psVar5 = psVar5 + iVar8;
      psVar7 = psVar7 + iVar2;
    }
  }
  return;
}

Assistant:

void ccopy_(integer *n, singlecomplex *cx, integer *incx, singlecomplex *
	cy, integer *incy)
{


    /* System generated locals */


    /* Local variables */
    integer i, ix, iy;


/*     copies a vector, x, to a vector, y.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define CY(I) cy[(I)-1]
#define CX(I) cx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	CY(iy).r = CX(ix).r, CY(iy).i = CX(ix).i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	CY(i).r = CX(i).r, CY(i).i = CX(i).i;
/* L30: */
    }
    return;
}